

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O2

void Execute(function<int_(int)> *function)

{
  ostream *poVar1;
  int i;
  int __args;
  duration<double,_std::ratio<1L,_1L>_> dVar2;
  duration<double,_std::ratio<1L,_1L>_> dVar3;
  double dVar4;
  
  dVar2 = GetCurrentTime();
  for (__args = 0; __args != 1000000; __args = __args + 1) {
    std::function<int_(int)>::operator()(function,__args);
  }
  dVar3 = GetCurrentTime();
  dVar4 = (dVar3.__r - dVar2.__r) * 1000.0;
  std::operator<<((ostream *)&std::cout,'\t');
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar1,'\t');
  poVar1 = std::ostream::_M_insert<double>(dVar4 / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Execute(const std::function<int(int)>& function) {
  const auto start_time = GetCurrentTime();
  for (int i = 0; i < kIterations; ++i) {
    function(i);
  }
  const auto finish_time = GetCurrentTime();
  const double elapsed_ms = 1000. * (finish_time - start_time).count();
  std::cout << '\t' << elapsed_ms << '\t' << elapsed_ms / kIterations
            << std::endl;
}